

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_intermediate_code_aarch64(CPUState *cpu,TranslationBlock *tb,int max_insns)

{
  TranslatorOps *ops;
  DisasContext_conflict1 dc;
  DisasContextBase aDStack_178 [8];
  
  memset(aDStack_178,0,0x158);
  ops = &thumb_translator_ops;
  if ((tb->flags >> 8 & 1) == 0) {
    ops = &arm_translator_ops;
  }
  if ((int)tb->flags < 0) {
    ops = &aarch64_translator_ops_aarch64;
  }
  translator_loop_aarch64(ops,aDStack_178,cpu,tb,max_insns);
  return;
}

Assistant:

void gen_intermediate_code(CPUState *cpu, TranslationBlock *tb, int max_insns)
{
    DisasContext dc = { 0 };
    const TranslatorOps *ops = &arm_translator_ops;

    if (FIELD_EX32(tb->flags, TBFLAG_AM32, THUMB)) {
        ops = &thumb_translator_ops;
    }
#ifdef TARGET_AARCH64
    if (FIELD_EX32(tb->flags, TBFLAG_ANY, AARCH64_STATE)) {
        ops = &aarch64_translator_ops;
    }
#endif

    translator_loop(ops, &dc.base, cpu, tb, max_insns);
}